

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fstack.cpp
# Opt level: O1

bool yywrap(void)

{
  LexerState **ppLVar1;
  size_t __size;
  FileStackNode *__src;
  Context *pCVar2;
  uint32_t uVar3;
  FileStackNode *__dest;
  Symbol *pSVar4;
  int *piVar5;
  char *pcVar6;
  uint uVar7;
  int value;
  
  uVar3 = lexer_GetIFDepth();
  pCVar2 = contextStack;
  if (uVar3 != 0) {
    pcVar6 = "s";
    if (uVar3 == 1) {
      pcVar6 = "";
    }
    fatalerror("Ended block with %u unterminated IF construct%s\n",(ulong)uVar3,pcVar6);
  }
  __src = contextStack->fileInfo;
  if (__src->type == NODE_REPT) {
    __dest = __src;
    if (__src->referenced == true) {
      __size = (ulong)*(uint *)&__src[1].parent * 4 + 0x30;
      __dest = (FileStackNode *)malloc(__size);
      if (__dest == (FileStackNode *)0x0) {
        piVar5 = __errno_location();
        pcVar6 = strerror(*piVar5);
        fatalerror("Failed to duplicate REPT file node: %s\n",pcVar6);
      }
      memcpy(__dest,__src,__size);
      __dest->next = (FileStackNode *)0x0;
      __dest->referenced = false;
      pCVar2->fileInfo = __dest;
    }
    if ((pCVar2->forName != (char *)0x0) &&
       (*(uint *)((long)&__dest[1].parent + 4) <= pCVar2->nbReptIters)) {
      value = pCVar2->forStep + pCVar2->forValue;
      pCVar2->forValue = value;
      pSVar4 = sym_AddVar(pCVar2->forName,value);
      if (pSVar4->type != SYM_VAR) {
        fatalerror("Failed to update FOR symbol value\n");
      }
    }
    uVar7 = *(int *)((long)&__dest[1].parent + 4) + 1;
    *(uint *)((long)&__dest[1].parent + 4) = uVar7;
    if (uVar7 <= contextStack->nbReptIters) {
      lexer_RestartRept(contextStack->fileInfo->lineNo);
      uVar3 = macro_UseNewUniqueID();
      contextStack->uniqueID = uVar3;
      return false;
    }
  }
  else if (contextStack->parent == (Context *)0x0) {
    return true;
  }
  pCVar2 = contextStack;
  if (contextDepth != 0) {
    contextDepth = contextDepth - 1;
    ppLVar1 = &contextStack->lexerState;
    contextStack = contextStack->parent;
    lexer_DeleteState(*ppLVar1);
    if (pCVar2->fileInfo->type == NODE_MACRO) {
      macro_UseNewArgs(contextStack->macroArgs);
    }
    if (pCVar2->fileInfo->referenced == false) {
      free(pCVar2->fileInfo);
    }
    free(pCVar2->forName);
    free(pCVar2);
    lexerState = contextStack->lexerState;
    macro_SetUniqueID(contextStack->uniqueID);
    return false;
  }
  contextStack = contextStack->parent;
  __assert_fail("contextDepth != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/fstack.cpp"
                ,0x10e,"yywrap");
}

Assistant:

bool yywrap(void)
{
	uint32_t ifDepth = lexer_GetIFDepth();

	if (ifDepth != 0)
		fatalerror("Ended block with %" PRIu32 " unterminated IF construct%s\n",
			   ifDepth, ifDepth == 1 ? "" : "s");

	if (contextStack->fileInfo->type == NODE_REPT) {
		// The context is a REPT or FOR block, which may loop
		struct FileStackReptNode *fileInfo = (struct FileStackReptNode *)contextStack->fileInfo;

		// If the node is referenced, we can't edit it; duplicate it
		if (contextStack->fileInfo->referenced) {
			size_t size = sizeof(*fileInfo) + sizeof(fileInfo->iters[0]) * fileInfo->reptDepth;
			struct FileStackReptNode *copy = (struct FileStackReptNode *)malloc(size);

			if (!copy)
				fatalerror("Failed to duplicate REPT file node: %s\n", strerror(errno));
			// Copy all info but the referencing
			memcpy(copy, fileInfo, size);
			copy->node.next = NULL;
			copy->node.referenced = false;

			fileInfo = copy;
			contextStack->fileInfo = (struct FileStackNode *)fileInfo;
		}

		// If this is a FOR, update the symbol value
		if (contextStack->forName && fileInfo->iters[0] <= contextStack->nbReptIters) {
			// Avoid arithmetic overflow runtime error
			uint32_t forValue = (uint32_t)contextStack->forValue +
				(uint32_t)contextStack->forStep;
			contextStack->forValue = forValue >= 0 ? (int32_t)forValue
				: -(int32_t)~forValue - 1;
			struct Symbol *sym = sym_AddVar(contextStack->forName,
				contextStack->forValue);

			// This error message will refer to the current iteration
			if (sym->type != SYM_VAR)
				fatalerror("Failed to update FOR symbol value\n");
		}
		// Advance to the next iteration
		fileInfo->iters[0]++;
		// If this wasn't the last iteration, wrap instead of popping
		if (fileInfo->iters[0] <= contextStack->nbReptIters) {
			lexer_RestartRept(contextStack->fileInfo->lineNo);
			contextStack->uniqueID = macro_UseNewUniqueID();
			return false;
		}
	} else if (!contextStack->parent) {
		return true;
	}

	struct Context *context = contextStack;

	contextStack = contextStack->parent;
	assert(contextDepth != 0); // This is never supposed to underflow
	contextDepth--;

	lexer_DeleteState(context->lexerState);
	// Restore args if a macro (not REPT) saved them
	if (context->fileInfo->type == NODE_MACRO)
		macro_UseNewArgs(contextStack->macroArgs);
	// Free the file stack node
	if (!context->fileInfo->referenced)
		free(context->fileInfo);
	// Free the FOR symbol name
	free(context->forName);
	// Free the entry and make its parent the current entry
	free(context);

	lexer_SetState(contextStack->lexerState);
	macro_SetUniqueID(contextStack->uniqueID);

	return false;
}